

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall wabt::anon_unknown_15::BinaryReaderObjdump::EndInitExpr(BinaryReaderObjdump *this)

{
  BinaryReaderObjdump *this_local;
  
  if ((this->reading_data_init_expr_ & 1U) == 0) {
    if ((this->reading_elem_init_expr_ & 1U) == 0) {
      if ((this->reading_global_init_expr_ & 1U) == 0) {
        abort();
      }
      this->reading_global_init_expr_ = false;
      PrintInitExpr(this,&this->current_init_expr_,false);
    }
    else {
      this->reading_elem_init_expr_ = false;
      InitExprToConstOffset(&this->current_init_expr_,&this->elem_offset_);
    }
  }
  else {
    this->reading_data_init_expr_ = false;
    InitExprToConstOffset(&this->current_init_expr_,&this->data_offset_);
  }
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdump::EndInitExpr() {
  if (reading_data_init_expr_) {
    reading_data_init_expr_ = false;
    InitExprToConstOffset(current_init_expr_, &data_offset_);
  } else if (reading_elem_init_expr_) {
    reading_elem_init_expr_ = false;
    InitExprToConstOffset(current_init_expr_, &elem_offset_);
  } else if (reading_global_init_expr_) {
    reading_global_init_expr_ = false;
    PrintInitExpr(current_init_expr_);
  } else {
    WABT_UNREACHABLE;
  }
  return Result::Ok;
}